

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O0

int csp_can_add_interface(csp_iface_t *iface)

{
  csp_iface_t *in_RDI;
  csp_can_interface_data_t *ifdata;
  int local_4;
  
  if (((in_RDI == (csp_iface_t *)0x0) || (in_RDI->name == (char *)0x0)) ||
     (in_RDI->interface_data == (void *)0x0)) {
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->interface_data + 8) == 0) {
    local_4 = -2;
  }
  else {
    *(undefined4 *)in_RDI->interface_data = 0;
    if (csp_conf.version == '\x01') {
      in_RDI->nexthop = csp_can1_tx;
    }
    else {
      in_RDI->nexthop = csp_can2_tx;
    }
    csp_iflist_add(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int csp_can_add_interface(csp_iface_t * iface) {

	if ((iface == NULL) || (iface->name == NULL) || (iface->interface_data == NULL)) {
		return CSP_ERR_INVAL;
	}

	csp_can_interface_data_t * ifdata = iface->interface_data;
	if (ifdata->tx_func == NULL) {
		return CSP_ERR_INVAL;
	}

	ifdata->cfp_packet_counter = 0;

	if (csp_conf.version == 1) {
		iface->nexthop = csp_can1_tx;
	} else {
		iface->nexthop = csp_can2_tx;
	}

	csp_iflist_add(iface);

	return CSP_ERR_NONE;
}